

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O0

void project_m(source origin,wchar_t r,loc grid,wchar_t dam,wchar_t typ,wchar_t flg,_Bool *did_hit,
              _Bool *was_obvious)

{
  undefined8 uVar1;
  _Bool _Var2;
  _Bool _Var3;
  wchar_t idx;
  uint32_t uVar4;
  square_conflict *psVar5;
  monster_conflict *mon_00;
  anon_enum_32 aVar6;
  bool bVar7;
  char local_128 [8];
  char m_name [80];
  monster *caster;
  project_monster_handler_context_t context;
  project_monster_handler_f monster_handler;
  wchar_t m_idx;
  _Bool beguile;
  _Bool charm;
  _Bool id;
  _Bool obvious;
  _Bool mon_died;
  _Bool seen;
  monster_lore *lore;
  monster *mon;
  wchar_t typ_local;
  wchar_t dam_local;
  wchar_t r_local;
  loc grid_local;
  source origin_local;
  
  aVar6 = origin.what;
  bVar7 = (flg & 0x100U) != 0;
  if (aVar6 == SRC_PLAYER) {
    _Var2 = flag_has_dbg((player->state).pflags,10,0x1e,"player->state.pflags","(PF_CHARM)");
  }
  else {
    _Var2 = false;
  }
  if (aVar6 == SRC_PLAYER) {
    _Var3 = flag_has_dbg((player->state).pflags,10,0x41,"player->state.pflags","(PF_BEGUILE)");
  }
  else {
    _Var3 = false;
  }
  psVar5 = square((chunk *)cave,(loc_conflict)grid);
  idx = (wchar_t)psVar5->mon;
  context.mon_timed._32_8_ = monster_handlers[typ];
  caster = (monster *)CONCAT44(grid_local.y,aVar6);
  context.dam._0_1_ = 0;
  context.type = L'\0';
  context.seen = false;
  context.id = false;
  context._38_2_ = 0;
  context.mon = (monster *)0x0;
  context.lore._3_1_ = 0;
  context.lore._4_2_ = 0;
  context.charm = false;
  context.beguile = false;
  context.obvious = false;
  context.skipped = false;
  context.flag = 0;
  context._62_2_ = 0;
  context.do_poly = L'\0';
  context.teleport_distance = L'\x01';
  context.origin._0_8_ = origin.which;
  context.origin.which.monster = r;
  context._12_8_ = grid;
  context.grid.x = dam;
  context.grid.y = typ;
  context.dam._1_1_ = aVar6 == SRC_PLAYER && !bVar7;
  context.lore._0_1_ = _Var2 != false;
  context.lore._1_1_ = _Var3 != false;
  context.lore._2_1_ = bVar7;
  memset(&context.hurt_msg,0,0x28);
  memcpy(&context.hurt_msg,&DAT_002b1cdc,0x28);
  *did_hit = false;
  *was_obvious = false;
  _Var2 = square_ispassable((chunk *)cave,(loc_conflict)grid);
  if (((_Var2) && (L'\0' < idx)) &&
     ((origin_local.what = origin.which._0_4_, aVar6 != SRC_MONSTER || (origin_local.what != idx))))
  {
    mon_00 = cave_monster(cave,idx);
    context.mon = (monster *)get_lore(mon_00->race);
    context._32_8_ = mon_00;
    _Var2 = monster_is_camouflaged((monster *)mon_00);
    if (_Var2) {
      _Var2 = monster_is_in_view((monster *)mon_00);
      if (_Var2) {
        context.dam._0_1_ = 1;
      }
    }
    else {
      _Var2 = monster_is_visible((monster *)mon_00);
      if (_Var2) {
        context.dam._0_1_ = 1;
      }
    }
    if (((aVar6 != SRC_MONSTER) || ((flg & 0x200U) == 0)) ||
       ((m_name._72_8_ = cave_monster(cave,origin_local.what),
        (monster_conflict *)m_name._72_8_ != (monster_conflict *)0x0 &&
        (((monster_conflict *)m_name._72_8_)->race != mon_00->race)))) {
      _Var2 = square_isprotect((chunk *)cave,(loc_conflict)grid);
      if ((((_Var2) && (uVar4 = Rand_div(4), uVar4 == 0)) &&
          (_Var2 = flag_has_dbg(mon_00->race->flags,0xc,0x1b,"mon->race->flags","RF_NEVER_MOVE"),
          !_Var2)) && (mon_00->m_timed[0] == 0)) {
        monster_desc(local_128,0x50,(monster *)mon_00,L'̔');
        _Var2 = square_isrubble((chunk *)cave,(loc_conflict)grid);
        if (_Var2) {
          msg("%s ducks behind a boulder!",local_128);
          return;
        }
        _Var2 = square_istree((chunk *)cave,(loc_conflict)grid);
        if (_Var2) {
          msg("%s hides behind a tree!",local_128);
          return;
        }
      }
      _Var2 = monster_is_destroyed((monster *)mon_00);
      if (_Var2) {
        context.teleport_distance = L'\x02';
      }
      if ((((flg & 8U) != 0) && (_Var2 = monster_is_camouflaged((monster *)mon_00), _Var2)) &&
         (_Var2 = monster_is_in_view((monster *)mon_00), _Var2)) {
        become_aware((chunk *)cave,(monster *)mon_00);
        _Var2 = monster_is_visible((monster *)mon_00);
        if (_Var2) {
          context.dam._0_1_ = 1;
        }
      }
      if (((projections[typ].obvious & 1U) != 0) && (((byte)context.dam & 1) != 0)) {
        context.lore._2_1_ = 1;
      }
      context.grid.x =
           terrain_adjust_dam((player *)0x0,(monster *)context._32_8_,typ,context.grid.x);
      if (context.mon_timed._32_8_ != 0) {
        (*(code *)context.mon_timed._32_8_)(&caster);
      }
      if ((projections[typ].wake & 1U) != 0) {
        monster_wake((monster *)mon_00,false,L'd');
      }
      if ((context.lore._3_1_ & 1) == 0) {
        if (aVar6 == SRC_MONSTER) {
          m_idx._2_1_ = project_m_monster_attack((project_monster_handler_context_t *)&caster,idx);
        }
        else {
          m_idx._2_1_ = project_m_player_attack((project_monster_handler_context_t *)&caster);
        }
        if (m_idx._2_1_ == false) {
          project_m_apply_side_effects((project_monster_handler_context_t *)&caster,idx);
        }
        uVar1 = context._32_8_;
        _Var2 = (_Bool)(context.lore._2_1_ & 1);
        if (context._32_8_ != 0) {
          if ((m_idx._2_1_ == false) &&
             (update_mon((monster *)context._32_8_,(chunk *)cave,false), aVar6 == SRC_PLAYER)) {
            *(undefined4 *)(uVar1 + 0x1a8) = 0xffffffff;
          }
          square_light_spot((chunk *)cave,*(loc *)(uVar1 + 0x24));
          if (player->upkeep->monster_race == *(monster_race **)uVar1) {
            player->upkeep->redraw = player->upkeep->redraw | 0x100000;
          }
        }
        *did_hit = true;
        *was_obvious = _Var2;
      }
    }
  }
  return;
}

Assistant:

void project_m(struct source origin, int r, struct loc grid, int dam, int typ,
			   int flg, bool *did_hit, bool *was_obvious)
{
	struct monster *mon;
	struct monster_lore *lore;

	/* Is the monster "seen"? */
	bool seen = false;
	bool mon_died = false;

	/* Is the effect obvious? */
	bool obvious = (flg & PROJECT_AWARE ? true : false);

	/* Are we trying to id the source of this effect? */
	bool id = (origin.what == SRC_PLAYER) ? !obvious : false;

	/* Is the source an extra charming player? */
	bool charm = (origin.what == SRC_PLAYER) ?
		player_has(player, PF_CHARM) : false;

	/* Is the source an extra beguiling player? */
	bool beguile = (origin.what == SRC_PLAYER) ?
		player_has(player, PF_BEGUILE) : false;

	int m_idx = square(cave, grid)->mon;

	project_monster_handler_f monster_handler = monster_handlers[typ];
	project_monster_handler_context_t context = {
		origin,
		r,
		grid,
		dam,
		typ,
		seen,
		id,
		NULL, /* mon */
		NULL, /* lore */
		charm,
		beguile,
		obvious,
		false, /* skipped */
		0, /* flag */
		0, /* do_poly */
		0, /* teleport_distance */
		MON_MSG_NONE, /* hurt_msg */
		MON_MSG_DIE, /* die_msg */
		{0, 0, 0, 0, 0, 0},
	};

	*did_hit = false;
	*was_obvious = false;

	/* Walls protect monsters */
	if (!square_ispassable(cave, grid)) return;

	/* No monster here */
	if (!(m_idx > 0)) return;

	/* Never affect projector */
	if (origin.what == SRC_MONSTER && origin.which.monster == m_idx) return;

	/* Obtain monster info */
	mon = cave_monster(cave, m_idx);
	lore = get_lore(mon->race);
	context.mon = mon;
	context.lore = lore;

	/* See visible monsters */
	if (monster_is_camouflaged(mon)) {
		if (monster_is_in_view(mon)) {
			seen = true;
			context.seen = true;
		}
	} else if (monster_is_visible(mon)) {
		seen = true;
		context.seen = seen;
	}

	/* Breathers may not blast members of the same race. */
	if (origin.what == SRC_MONSTER && (flg & PROJECT_SAFE)) {
		/* Point to monster information of caster */
		struct monster *caster = cave_monster(cave, origin.which.monster);
		if (!caster) return;

		/* Skip monsters with the same race */
		if (caster->race == mon->race)
			return;
	}

	/* Determine if terrain is capable of preventing physical damage. */
	if (square_isprotect(cave, grid)) {
		if (one_in_(4) && !rf_has(mon->race->flags, RF_NEVER_MOVE) &&
			!mon->m_timed[MON_TMD_SLEEP]) {
			char m_name[80];

			/* Get the monster name (or "it") */
			monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);

			/* Monsters can duck behind rubble */
			if (square_isrubble(cave, grid)) {
				msg("%s ducks behind a boulder!", m_name);
				return;
			}

			if (square_istree(cave, grid)) {
				msg("%s hides behind a tree!", m_name);
				return;
			}
		}
	}

	/* Some monsters get "destroyed" */
	if (monster_is_destroyed(mon))
		context.die_msg = MON_MSG_DESTROYED;

	/* Reveal a camouflaged monster if in view and it stopped an effect. */
	if ((flg & PROJECT_STOP) && monster_is_camouflaged(mon)
			&& monster_is_in_view(mon)) {
		become_aware(cave, mon);
		/* Reevaluate whether it's seen. */
		if (monster_is_visible(mon)) {
			seen = true;
			context.seen = true;
		}
	}

	/* Force obviousness for certain types if seen. */
	if (projections[typ].obvious && context.seen)
		context.obvious = true;

	/* Adjust damage for terrain */
	context.dam = terrain_adjust_dam(NULL, context.mon, typ, context.dam);

	if (monster_handler != NULL)
		monster_handler(&context);

	/* Wake monster if required */
	if (projections[typ].wake)
		monster_wake(mon, false, 100);

	/* Absolutely no effect */
	if (context.skipped) return;

	/* Apply damage to the monster, based on who did the damage. */
	if (origin.what == SRC_MONSTER) {
		mon_died = project_m_monster_attack(&context, m_idx);
	} else {
		mon_died = project_m_player_attack(&context);
	}

	if (!mon_died) {
		project_m_apply_side_effects(&context, m_idx);
	}

	/* Update locals, since the project_m_* functions can change some values. */
	mon = context.mon;
	obvious = context.obvious;

	/* Check for NULL, since polymorph can occasionally return NULL. */
	if (mon != NULL) {
		/* Update the monster */
		if (!mon_died) {
			update_mon(mon, cave, false);

			/* Become hostile (to the player only, for now) */
			if (origin.what == SRC_PLAYER) {
				mon->target.midx = -1;
			}
		}

		/* Redraw the (possibly new) monster grid */
		square_light_spot(cave, mon->grid);

		/* Update monster recall window */
		if (player->upkeep->monster_race == mon->race) {
			/* Window stuff */
			player->upkeep->redraw |= (PR_MONSTER);
		}
	}

	/* Track it */
	*did_hit = true;

	/* Return "Anything seen?" */
	*was_obvious = !!obvious;
}